

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * shared_container_extract_copy(shared_container_t *sc,uint8_t *typecode)

{
  uint8_t typecode_00;
  container_t *c;
  
  if (sc->counter == 0) {
    __assert_fail("sc->counter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d38,
                  "container_t *shared_container_extract_copy(shared_container_t *, uint8_t *)");
  }
  typecode_00 = sc->typecode;
  if (typecode_00 != '\x04') {
    sc->counter = sc->counter - 1;
    *typecode = typecode_00;
    c = sc->container;
    if (sc->counter == 0) {
      free(sc);
    }
    else {
      c = container_clone(c,typecode_00);
    }
    if (*typecode != '\x04') {
      return c;
    }
    __assert_fail("*typecode != SHARED_CONTAINER_TYPE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d44,
                  "container_t *shared_container_extract_copy(shared_container_t *, uint8_t *)");
  }
  __assert_fail("sc->typecode != SHARED_CONTAINER_TYPE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x2d39,
                "container_t *shared_container_extract_copy(shared_container_t *, uint8_t *)");
}

Assistant:

container_t *shared_container_extract_copy(
    shared_container_t *sc, uint8_t *typecode
){
    assert(sc->counter > 0);
    assert(sc->typecode != SHARED_CONTAINER_TYPE);
    sc->counter--;
    *typecode = sc->typecode;
    container_t *answer;
    if (sc->counter == 0) {
        answer = sc->container;
        sc->container = NULL;  // paranoid
        free(sc);
    } else {
        answer = container_clone(sc->container, *typecode);
    }
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return answer;
}